

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O0

bool __thiscall
ssl_credential_st::SetLeafCert
          (ssl_credential_st *this,UniquePtr<CRYPTO_BUFFER> *leaf,bool discard_key_on_mismatch)

{
  bool bVar1;
  int iVar2;
  pointer pcVar3;
  EVP_PKEY *pEVar4;
  pointer pubkey;
  pointer privkey;
  pointer psVar5;
  CRYPTO_BUFFER *buf;
  bool bVar6;
  unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> local_60 [3];
  undefined4 local_44;
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_40;
  UniquePtr<EVP_PKEY> new_pubkey;
  CBS cbs;
  bool private_key_matches_leaf;
  bool discard_key_on_mismatch_local;
  UniquePtr<CRYPTO_BUFFER> *leaf_local;
  ssl_credential_st *this_local;
  
  bVar1 = UsesX509(this);
  if (!bVar1) {
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                  ,0xd0);
    return false;
  }
  bVar6 = this->type != kDelegated;
  pcVar3 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get(leaf);
  CRYPTO_BUFFER_init_CBS(pcVar3,(CBS *)&new_pubkey);
  bssl::ssl_cert_parse_pubkey((bssl *)&local_40,(CBS *)&new_pubkey);
  bVar1 = std::operator==(&local_40,(nullptr_t)0x0);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    pEVar4 = (EVP_PKEY *)std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&local_40);
    iVar2 = EVP_PKEY_id(pEVar4);
    bVar1 = bssl::ssl_is_key_type_supported(iVar2);
    if (bVar1) {
      pEVar4 = (EVP_PKEY *)std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&local_40);
      iVar2 = EVP_PKEY_id(pEVar4);
      if ((iVar2 != 0x198) ||
         (bVar1 = bssl::ssl_cert_check_key_usage((CBS *)&new_pubkey,key_usage_digital_signature),
         bVar1)) {
        if ((bVar6) && (bVar1 = std::operator!=(&this->privkey,(nullptr_t)0x0), bVar1)) {
          pubkey = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&local_40);
          privkey = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&this->privkey);
          bVar1 = bssl::ssl_compare_public_and_private_key(pubkey,privkey);
          if (!bVar1) {
            if (!discard_key_on_mismatch) {
              this_local._7_1_ = false;
              goto LAB_0019ab12;
            }
            ERR_clear_error();
            std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::operator=
                      (&this->privkey,(nullptr_t)0x0);
          }
        }
        bVar1 = std::operator==(&this->chain,(nullptr_t)0x0);
        if (bVar1) {
          bssl::new_leafless_chain();
          std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::operator=
                    (&this->chain,local_60);
          std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr(local_60);
          bVar1 = std::operator==(&this->chain,(nullptr_t)0x0);
          if (bVar1) {
            this_local._7_1_ = false;
            goto LAB_0019ab12;
          }
        }
        psVar5 = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get(&this->chain)
        ;
        buf = sk_CRYPTO_BUFFER_value(psVar5,0);
        CRYPTO_BUFFER_free(buf);
        psVar5 = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get(&this->chain)
        ;
        pcVar3 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::release(leaf);
        sk_CRYPTO_BUFFER_set(psVar5,0,pcVar3);
        if (bVar6) {
          std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::operator=(&this->pubkey,&local_40);
        }
        this_local._7_1_ = true;
      }
      else {
        ERR_put_error(0x10,0,0xe4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                      ,0xe6);
        this_local._7_1_ = false;
      }
    }
    else {
      ERR_put_error(0x10,0,0xe4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                    ,0xde);
      this_local._7_1_ = false;
    }
  }
LAB_0019ab12:
  local_44 = 1;
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_40);
  return this_local._7_1_;
}

Assistant:

bool ssl_credential_st::SetLeafCert(UniquePtr<CRYPTO_BUFFER> leaf,
                                    bool discard_key_on_mismatch) {
  if (!UsesX509()) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return false;
  }

  const bool private_key_matches_leaf = type != SSLCredentialType::kDelegated;

  CBS cbs;
  CRYPTO_BUFFER_init_CBS(leaf.get(), &cbs);
  UniquePtr<EVP_PKEY> new_pubkey = ssl_cert_parse_pubkey(&cbs);
  if (new_pubkey == nullptr) {
    return false;
  }

  if (!ssl_is_key_type_supported(EVP_PKEY_id(new_pubkey.get()))) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNKNOWN_CERTIFICATE_TYPE);
    return false;
  }

  // An ECC certificate may be usable for ECDH or ECDSA. We only support ECDSA
  // certificates, so sanity-check the key usage extension.
  if (EVP_PKEY_id(new_pubkey.get()) == EVP_PKEY_EC &&
      !ssl_cert_check_key_usage(&cbs, key_usage_digital_signature)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNKNOWN_CERTIFICATE_TYPE);
    return false;
  }

  if (private_key_matches_leaf && privkey != nullptr &&
      !ssl_compare_public_and_private_key(new_pubkey.get(), privkey.get())) {
    if (!discard_key_on_mismatch) {
      return false;
    }
    ERR_clear_error();
    privkey = nullptr;
  }

  if (chain == nullptr) {
    chain = new_leafless_chain();
    if (chain == nullptr) {
      return false;
    }
  }

  CRYPTO_BUFFER_free(sk_CRYPTO_BUFFER_value(chain.get(), 0));
  sk_CRYPTO_BUFFER_set(chain.get(), 0, leaf.release());
  if (private_key_matches_leaf) {
    pubkey = std::move(new_pubkey);
  }
  return true;
}